

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O0

void __thiscall
HighsMipSolverData::saveReportMipSolution(HighsMipSolverData *this,double new_upper_limit)

{
  HighsLp *lp;
  bool bVar1;
  double *pdVar2;
  vector<double,_std::allocator<double>_> *in_RDI;
  vector<double,_std::allocator<double>_> *in_XMM0_Qa;
  FILE *file;
  HighsObjectiveSolution record;
  bool interrupt;
  bool non_improving;
  undefined1 in_stack_000002a7;
  vector<double,_std::allocator<double>_> *in_stack_000002a8;
  HighsLp *in_stack_000002b0;
  HighsLogOptions *in_stack_000002b8;
  FILE *in_stack_000002c0;
  undefined7 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff57;
  value_type *in_stack_ffffffffffffff58;
  allocator *in_stack_ffffffffffffff60;
  vector<bool,_std::allocator<bool>_> *in_stack_ffffffffffffff70;
  HighsLogOptions *in_stack_ffffffffffffff78;
  FILE *in_stack_ffffffffffffff80;
  string *in_stack_ffffffffffffffa0;
  double in_stack_ffffffffffffffa8;
  string local_50 [4];
  int in_stack_ffffffffffffffb4;
  HighsMipSolverData *in_stack_ffffffffffffffb8;
  reference local_28;
  undefined7 in_stack_ffffffffffffffe8;
  undefined1 uVar3;
  
  uVar3 = (double)in_RDI[0x453].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start <= (double)in_XMM0_Qa;
  if ((((ulong)(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start[0x16] & 1) == 0) && (!(bool)uVar3)) {
    bVar1 = std::function::operator_cast_to_bool
                      ((function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
                        *)CONCAT17(in_stack_ffffffffffffff57,in_stack_ffffffffffffff50));
    if (bVar1) {
      local_28 = std::vector<bool,_std::allocator<bool>_>::operator[]
                           (in_stack_ffffffffffffff70,(size_type)in_RDI);
      bVar1 = std::_Bit_reference::operator_cast_to_bool(&local_28);
      if (bVar1) {
        HighsCallback::clearHighsCallbackDataOut
                  ((HighsCallback *)
                   *(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_start);
        pdVar2 = std::vector<double,_std::allocator<double>_>::data
                           ((vector<double,_std::allocator<double>_> *)0x626dec);
        *(double **)
         ((long)*(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_start + 0xa8) = pdVar2;
        in_stack_ffffffffffffff58 =
             (value_type *)
             (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
             super__Vector_impl_data._M_start[8];
        in_stack_ffffffffffffff60 = (allocator *)&stack0xffffffffffffffaf;
        std::allocator<char>::allocator();
        std::__cxx11::string::string(local_50,"Improving solution",in_stack_ffffffffffffff60);
        interruptFromCallbackWithData
                  (in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8,
                   in_stack_ffffffffffffffa0);
        std::__cxx11::string::~string(local_50);
        std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffaf);
      }
    }
    if ((*(byte *)((long)(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start[1] + 0x350) & 1) != 0) {
      HighsObjectiveSolution::HighsObjectiveSolution((HighsObjectiveSolution *)0x626ed1);
      in_stack_ffffffffffffff78 =
           (HighsLogOptions *)
           (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_start[8];
      std::vector<double,_std::allocator<double>_>::operator=
                (in_XMM0_Qa,
                 (vector<double,_std::allocator<double>_> *)
                 CONCAT17(uVar3,in_stack_ffffffffffffffe8));
      std::vector<HighsObjectiveSolution,_std::allocator<HighsObjectiveSolution>_>::push_back
                ((vector<HighsObjectiveSolution,_std::allocator<HighsObjectiveSolution>_> *)
                 in_stack_ffffffffffffff60,in_stack_ffffffffffffff58);
      HighsObjectiveSolution::~HighsObjectiveSolution((HighsObjectiveSolution *)0x626f1c);
    }
    lp = (HighsLp *)
         (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
         super__Vector_impl_data._M_start[0x12];
    if (lp != (HighsLp *)0x0) {
      writeLpObjective(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,lp,in_RDI);
      writePrimalSolution(in_stack_000002c0,in_stack_000002b8,in_stack_000002b0,in_stack_000002a8,
                          (bool)in_stack_000002a7);
    }
  }
  return;
}

Assistant:

void HighsMipSolverData::saveReportMipSolution(const double new_upper_limit) {
  const bool non_improving = new_upper_limit >= upper_limit;
  if (mipsolver.submip) return;
  if (non_improving) return;

  if (mipsolver.callback_->user_callback) {
    if (mipsolver.callback_->active[kCallbackMipImprovingSolution]) {
      mipsolver.callback_->clearHighsCallbackDataOut();
      mipsolver.callback_->data_out.mip_solution = mipsolver.solution_.data();
      const bool interrupt = interruptFromCallbackWithData(
          kCallbackMipImprovingSolution, mipsolver.solution_objective_,
          "Improving solution");
      assert(!interrupt);
    }
  }

  if (mipsolver.options_mip_->mip_improving_solution_save) {
    HighsObjectiveSolution record;
    record.objective = mipsolver.solution_objective_;
    record.col_value = mipsolver.solution_;
    mipsolver.saved_objective_and_solution_.push_back(record);
  }
  FILE* file = mipsolver.improving_solution_file_;
  if (file) {
    writeLpObjective(file, mipsolver.options_mip_->log_options,
                     *(mipsolver.orig_model_), mipsolver.solution_);
    writePrimalSolution(
        file, mipsolver.options_mip_->log_options, *(mipsolver.orig_model_),
        mipsolver.solution_,
        mipsolver.options_mip_->mip_improving_solution_report_sparse);
  }
}